

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFParser.cc
# Opt level: O2

QPDFObjectHandle __thiscall QPDFParser::parse(QPDFParser *this,bool *empty,bool content_stream)

{
  long lVar1;
  InputSource *this_00;
  size_type sVar2;
  bool bVar3;
  undefined8 uVar4;
  qpdf_offset_t qVar5;
  char in_CL;
  undefined7 in_register_00000011;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  QPDFObjectHandle QVar6;
  string s;
  ParseGuard pg;
  allocator<char> local_59;
  string local_58;
  ParseGuard local_30;
  
  QPDF::ParseGuard::ParseGuard(&local_30,*(QPDF **)(empty + 0x20));
  *(undefined1 *)CONCAT71(in_register_00000011,content_stream) = 0;
  uVar4 = (**(code **)(**(long **)empty + 0x20))();
  *(undefined8 *)(empty + 0x78) = uVar4;
  bVar3 = ::qpdf::Tokenizer::nextToken
                    (*(Tokenizer **)(empty + 0x10),*(InputSource **)empty,*(string **)(empty + 8),0)
  ;
  if (!bVar3) {
    warn((QPDFParser *)empty,(string *)(*(long *)(empty + 0x10) + 0x50));
  }
  lVar1 = *(long *)(empty + 0x10);
  switch(*(undefined4 *)(lVar1 + 8)) {
  case 0:
    QPDFObject::create<QPDF_Null>();
    break;
  case 1:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"treating unexpected array close token as null",&local_59);
    warn((QPDFParser *)empty,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    QPDFObject::create<QPDF_Null>();
    break;
  case 2:
  case 6:
    std::vector<QPDFParser::StackFrame,_std::allocator<QPDFParser::StackFrame>_>::clear
              ((vector<QPDFParser::StackFrame,_std::allocator<QPDFParser::StackFrame>_> *)
               (empty + 0x48));
    local_58._M_dataplus._M_p._0_4_ = (uint)(*(int *)(*(long *)(empty + 0x10) + 8) == 2) * 2;
    std::vector<QPDFParser::StackFrame,std::allocator<QPDFParser::StackFrame>>::
    emplace_back<InputSource&,QPDFParser::parser_state_e>
              ((vector<QPDFParser::StackFrame,std::allocator<QPDFParser::StackFrame>> *)
               (empty + 0x48),*(InputSource **)empty,(parser_state_e *)&local_58);
    *(long *)(empty + 0x60) = *(long *)(empty + 0x50) + -0xa8;
    parseRemainder(this,SUB81(empty,0));
    goto LAB_001ac57c;
  case 3:
  case 4:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"treating unexpected brace token as null",&local_59);
    warn((QPDFParser *)empty,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    QPDFObject::create<QPDF_Null>();
    break;
  case 5:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"unexpected dictionary close token",&local_59);
    warn((QPDFParser *)empty,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    QPDFObject::create<QPDF_Null>();
    break;
  case 7:
    local_58._M_dataplus._M_p = (pointer)QUtil::string_to_ll(*(char **)(lVar1 + 0x30));
    withDescription<QPDF_Integer,long_long>(this,(longlong *)empty);
    goto LAB_001ac57c;
  case 8:
    withDescription<QPDF_Name,std::__cxx11::string_const&>
              (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)empty);
    goto LAB_001ac57c;
  case 9:
    withDescription<QPDF_Real,std::__cxx11::string_const&>
              (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)empty);
    goto LAB_001ac57c;
  case 10:
    if (*(long *)(empty + 0x18) == 0) {
      withDescription<QPDF_String,std::__cxx11::string_const&>
                (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)empty);
    }
    else {
      std::__cxx11::string::string((string *)&local_58,(string *)(lVar1 + 0x10));
      (**(code **)(**(long **)(empty + 0x18) + 0x10))(*(long **)(empty + 0x18),&local_58);
      withDescription<QPDF_String,std::__cxx11::string&>
                (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)empty);
      std::__cxx11::string::~string((string *)&local_58);
    }
    goto LAB_001ac57c;
  case 0xb:
    QPDFObject::create<QPDF_Null>();
    break;
  case 0xc:
    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (lVar1 + 0x30),"true");
    local_58._M_dataplus._M_p._0_1_ = bVar3;
    withDescription<QPDF_Bool,bool>(this,empty);
    goto LAB_001ac57c;
  case 0xd:
    if (in_CL != '\0') {
      withDescription<QPDF_Operator,std::__cxx11::string_const&>
                (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)empty);
      goto LAB_001ac57c;
    }
    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (lVar1 + 0x30),"endobj");
    if (!bVar3) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_58,"unknown token while reading object; treating as string",
                 &local_59);
      warn((QPDFParser *)empty,&local_58);
      std::__cxx11::string::~string((string *)&local_58);
      withDescription<QPDF_String,std::__cxx11::string_const&>
                (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)empty);
      goto LAB_001ac57c;
    }
    this_00 = *(InputSource **)empty;
    qVar5 = InputSource::getLastOffset(this_00);
    (*this_00->_vptr_InputSource[5])(this_00,qVar5,0);
    *(undefined1 *)CONCAT71(in_register_00000011,content_stream) = 1;
    QPDFObject::create<QPDF_Null>();
    break;
  case 0xe:
    if (in_CL != '\0') {
      this->input = (InputSource *)0x0;
      this->object_description = (string *)0x0;
      goto LAB_001ac57c;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"unexpected EOF",&local_59);
    warn((QPDFParser *)empty,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    QPDFObject::create<QPDF_Null>();
    break;
  default:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"treating unknown token type as null while reading object",
               &local_59);
    warn((QPDFParser *)empty,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    QPDFObject::create<QPDF_Null>();
  }
  sVar2 = local_58._M_string_length;
  local_58._M_string_length = 0;
  this->input = (InputSource *)local_58._M_dataplus._M_p;
  this->object_description = (string *)sVar2;
  local_58._M_dataplus._M_p = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_58._M_string_length);
LAB_001ac57c:
  QPDF::ParseGuard::~ParseGuard(&local_30);
  QVar6.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  QVar6.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar6.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDFParser::parse(bool& empty, bool content_stream)
{
    // This method must take care not to resolve any objects. Don't check the type of any object
    // without first ensuring that it is a direct object. Otherwise, doing so may have the side
    // effect of reading the object and changing the file pointer. If you do this, it will cause a
    // logic error to be thrown from QPDF::inParse().

    QPDF::ParseGuard pg(context);
    empty = false;
    start = input.tell();

    if (!tokenizer.nextToken(input, object_description)) {
        warn(tokenizer.getErrorMessage());
    }

    switch (tokenizer.getType()) {
    case QPDFTokenizer::tt_eof:
        if (content_stream) {
            // In content stream mode, leave object uninitialized to indicate EOF
            return {};
        }
        QTC::TC("qpdf", "QPDFParser eof in parse");
        warn("unexpected EOF");
        return {QPDFObject::create<QPDF_Null>()};

    case QPDFTokenizer::tt_bad:
        QTC::TC("qpdf", "QPDFParser bad token in parse");
        return {QPDFObject::create<QPDF_Null>()};

    case QPDFTokenizer::tt_brace_open:
    case QPDFTokenizer::tt_brace_close:
        QTC::TC("qpdf", "QPDFParser bad brace");
        warn("treating unexpected brace token as null");
        return {QPDFObject::create<QPDF_Null>()};

    case QPDFTokenizer::tt_array_close:
        QTC::TC("qpdf", "QPDFParser bad array close");
        warn("treating unexpected array close token as null");
        return {QPDFObject::create<QPDF_Null>()};

    case QPDFTokenizer::tt_dict_close:
        QTC::TC("qpdf", "QPDFParser bad dictionary close");
        warn("unexpected dictionary close token");
        return {QPDFObject::create<QPDF_Null>()};

    case QPDFTokenizer::tt_array_open:
    case QPDFTokenizer::tt_dict_open:
        stack.clear();
        stack.emplace_back(
            input,
            (tokenizer.getType() == QPDFTokenizer::tt_array_open) ? st_array : st_dictionary_key);
        frame = &stack.back();
        return parseRemainder(content_stream);

    case QPDFTokenizer::tt_bool:
        return withDescription<QPDF_Bool>(tokenizer.getValue() == "true");

    case QPDFTokenizer::tt_null:
        return {QPDFObject::create<QPDF_Null>()};

    case QPDFTokenizer::tt_integer:
        return withDescription<QPDF_Integer>(QUtil::string_to_ll(tokenizer.getValue().c_str()));

    case QPDFTokenizer::tt_real:
        return withDescription<QPDF_Real>(tokenizer.getValue());

    case QPDFTokenizer::tt_name:
        return withDescription<QPDF_Name>(tokenizer.getValue());

    case QPDFTokenizer::tt_word:
        {
            auto const& value = tokenizer.getValue();
            if (content_stream) {
                return withDescription<QPDF_Operator>(value);
            } else if (value == "endobj") {
                // We just saw endobj without having read anything.  Treat this as a null and do
                // not move the input source's offset.
                input.seek(input.getLastOffset(), SEEK_SET);
                empty = true;
                return {QPDFObject::create<QPDF_Null>()};
            } else {
                QTC::TC("qpdf", "QPDFParser treat word as string");
                warn("unknown token while reading object; treating as string");
                return withDescription<QPDF_String>(value);
            }
        }

    case QPDFTokenizer::tt_string:
        if (decrypter) {
            std::string s{tokenizer.getValue()};
            decrypter->decryptString(s);
            return withDescription<QPDF_String>(s);
        } else {
            return withDescription<QPDF_String>(tokenizer.getValue());
        }

    default:
        warn("treating unknown token type as null while reading object");
        return {QPDFObject::create<QPDF_Null>()};
    }
}